

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::timeEnd(ConsoleLogger *this,string *label)

{
  size_type sVar1;
  mapped_type *__rhs;
  ostream *poVar2;
  rep_conflict rVar3;
  double dVar4;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  duration<double,_std::ratio<1L,_1L>_> local_78;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point now;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *label_local;
  ConsoleLogger *this_local;
  
  local_18 = label;
  label_local = (string *)this;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ::count(&this->starttimes,label);
  if (sVar1 == 0) {
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Timer \"");
    std::operator+(local_38,(char *)local_58);
    warn<std::__cxx11::string>(this,local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
  }
  else {
    std::mutex::lock(&this->mtx);
    seconds.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
    __rhs = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
            ::operator[](&this->starttimes,local_18);
    local_80.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&seconds,__rhs);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_78,&local_80);
    if (this->loglevel < 1) {
      poVar2 = this->out;
      std::operator+((char *)local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x23791d);
      std::operator+(local_a0,(char *)local_c0);
      poVar2 = std::operator<<(poVar2,(string *)local_a0);
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_78);
      dVar4 = round(rVar3 * 1000000.0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4 * 0.001);
      poVar2 = std::operator<<(poVar2,"ms - timer ended");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_c0);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
    ::erase(&this->starttimes,local_18);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

inline void ConsoleLogger::timeEnd(const std::string& label)
{
	if (!starttimes.count(label))
	{
		warn("Timer \"" + label + "\" doesn't exist.");
		return;
	}
	mtx.lock();
	auto now = std::chrono::system_clock::now();
	std::chrono::duration<double> seconds = now - starttimes[label];
	if (loglevel <= 0)
		out << "    "+label+": " << 0.001*round(seconds.count()*1000000) << "ms - timer ended" << std::endl;
	starttimes.erase(label);
	mtx.unlock();
}